

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsRectVisible(ImVec2 *rect_min,ImVec2 *rect_max)

{
  bool bVar1;
  ImRect local_10;
  
  local_10.Min = *rect_min;
  local_10.Max = *rect_max;
  bVar1 = ImRect::Overlaps(&GImGui->CurrentWindow->ClipRect,&local_10);
  return bVar1;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& rect_min, const ImVec2& rect_max)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(rect_min, rect_max));
}